

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlotDeleteView.cpp
# Opt level: O3

void __thiscall SlotDeleteView::display(SlotDeleteView *this)

{
  display((SlotDeleteView *)&this[-1].super_DeleteView<Slot>.super_View.menuChoices);
  return;
}

Assistant:

void SlotDeleteView::display() {
    cout << "Enter the slot id to be deleted: ";
    Slot *slot = Slot::findById(Input::getInt());
    if (!slot) {
        cout << "No slot with this id exists.\n";
    } else {
        context.requestObjectId = slot->getId();
        DeleteView::display();
    };
    response->view = Controller::getInstance().getView("faculty-panel");
}